

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

_Bool next_value_greater_than_reporting_level_upper_bound
                (hdr_iter *iter,int64_t reporting_level_upper_bound)

{
  uint uVar1;
  hdr_histogram *phVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  phVar2 = iter->h;
  bVar3 = false;
  if (iter->counts_index < phVar2->counts_len) {
    uVar6 = iter->counts_index + 1;
    iVar5 = (int)uVar6 >> ((byte)phVar2->sub_bucket_half_count_magnitude & 0x1f);
    cVar4 = (char)iVar5 + -1;
    iVar7 = phVar2->sub_bucket_half_count;
    uVar1 = iVar7 - 1;
    if (iVar5 < 1) {
      cVar4 = '\0';
      iVar7 = 0;
    }
    bVar3 = reporting_level_upper_bound <
            (long)(int)(iVar7 + (uVar1 & uVar6)) << (cVar4 + (char)phVar2->unit_magnitude & 0x3fU);
  }
  return bVar3;
}

Assistant:

static bool next_value_greater_than_reporting_level_upper_bound(
    struct hdr_iter *iter, int64_t reporting_level_upper_bound)
{
    if (iter->counts_index >= iter->h->counts_len)
    {
        return false;
    }

    return peek_next_value_from_index(iter) > reporting_level_upper_bound;
}